

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystementry.cpp
# Opt level: O2

QString * __thiscall QFileSystemEntry::path(QString *__return_storage_ptr__,QFileSystemEntry *this)

{
  short sVar1;
  QChar ch;
  
  findLastSeparator(this);
  sVar1 = this->m_lastSeparator;
  if (sVar1 == 0) {
    ch.ucs = L'/';
  }
  else {
    if (sVar1 != -1) {
      QString::left(__return_storage_ptr__,&this->m_filePath,(long)sVar1);
      return __return_storage_ptr__;
    }
    ch.ucs = L'.';
  }
  QString::QString(__return_storage_ptr__,ch);
  return __return_storage_ptr__;
}

Assistant:

QString QFileSystemEntry::path() const
{
    findLastSeparator();
    if (m_lastSeparator == -1) {
#if defined(Q_OS_WIN)
        if (m_filePath.length() >= 2 && m_filePath.at(1) == u':')
            return m_filePath.left(2);
#endif
        return QString(u'.');
    }
    if (m_lastSeparator == 0)
        return QString(u'/');
#if defined(Q_OS_WIN)
    if (m_lastSeparator == 2 && m_filePath.at(1) == u':')
        return m_filePath.left(m_lastSeparator + 1);
#endif
    return m_filePath.left(m_lastSeparator);
}